

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::makeImageType
          (Builder *this,Id sampledType,Dim dim,bool depth,bool arrayed,bool ms,uint sampled,
          ImageFormat format)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  Id *pIVar3;
  iterator iVar4;
  iterator __position;
  uint uVar5;
  uint uVar6;
  Builder *pBVar7;
  SourceLanguage SVar8;
  uint uVar9;
  undefined3 in_register_00000081;
  undefined7 in_register_00000089;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  bool bVar13;
  Instruction *type;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  Builder *local_48;
  Builder *local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  local_38 = CONCAT31(in_register_00000081,arrayed);
  local_48 = this;
  if (1 < sampled - 1) {
    __assert_fail("sampled == 1 || sampled == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x1de,
                  "Id spv::Builder::makeImageType(Id, Dim, bool, bool, bool, unsigned int, ImageFormat)"
                 );
  }
  ppIVar2 = this->groupedTypes[0x19].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (uint)depth;
  uVar5 = (uint)arrayed;
  local_34 = (undefined4)CONCAT71(in_register_00000089,ms);
  uVar6 = (uint)ms;
  uVar9 = (uint)((ulong)((long)this->groupedTypes[0x19].
                               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3);
  bVar12 = 0 < (int)uVar9;
  pBVar7 = this;
  if (0 < (int)uVar9) {
    uVar10 = 1;
    do {
      local_40 = (Builder *)ppIVar2[uVar10 - 1];
      pIVar3 = (Id *)(local_40->sourceText)._M_dataplus._M_p;
      if ((((*pIVar3 == sampledType) && (pIVar3[1] == dim)) && (pIVar3[2] == uVar11)) &&
         (((pIVar3[3] == uVar5 && (pIVar3[4] == uVar6)) &&
          ((pIVar3[5] == sampled && (pIVar3[6] == format)))))) {
        pBVar7 = (Builder *)(ulong)local_40->source;
        break;
      }
      bVar12 = uVar10 < (uVar9 & 0x7fffffff);
      bVar13 = uVar10 != (uVar9 & 0x7fffffff);
      pBVar7 = local_40;
      uVar10 = uVar10 + 1;
    } while (bVar13);
  }
  if (bVar12) {
    return (Id)pBVar7;
  }
  local_40 = (Builder *)::dxil_spv::allocate_in_thread(0x38);
  SVar8 = local_48->uniqueId + SourceLanguageESSL;
  local_48->uniqueId = SVar8;
  local_40->_vptr_Builder = (_func_int **)&PTR__Instruction_001f81e0;
  local_40->source = SVar8;
  *(undefined8 *)&local_40->sourceVersion = 0x1900000000;
  (((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
   &(local_40->sourceText)._M_dataplus)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
  (local_40->sourceText)._M_string_length = 0;
  (local_40->sourceText).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(local_40->sourceText).field_2 + 8) = 0;
  iVar4._M_current = (uint *)(local_40->sourceText)._M_string_length;
  if (iVar4._M_current == (uint *)(local_40->sourceText).field_2._M_allocated_capacity) {
    local_50._M_head_impl._0_4_ = sampledType;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_40->sourceText,iVar4,(uint *)&local_50);
  }
  else {
    *iVar4._M_current = sampledType;
    (local_40->sourceText)._M_string_length = (size_type)(iVar4._M_current + 1);
  }
  iVar4._M_current = (uint *)(local_40->sourceText)._M_string_length;
  if (iVar4._M_current == (uint *)(local_40->sourceText).field_2._M_allocated_capacity) {
    local_50._M_head_impl._0_4_ = dim;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_40->sourceText,iVar4,(uint *)&local_50);
  }
  else {
    *iVar4._M_current = dim;
    (local_40->sourceText)._M_string_length = (size_type)(iVar4._M_current + 1);
  }
  iVar4._M_current = (uint *)(local_40->sourceText)._M_string_length;
  if (iVar4._M_current == (uint *)(local_40->sourceText).field_2._M_allocated_capacity) {
    local_50._M_head_impl._0_4_ = uVar11;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_40->sourceText,iVar4,(uint *)&local_50);
  }
  else {
    *iVar4._M_current = uVar11;
    (local_40->sourceText)._M_string_length = (size_type)(iVar4._M_current + 1);
  }
  iVar4._M_current = (uint *)(local_40->sourceText)._M_string_length;
  if (iVar4._M_current == (uint *)(local_40->sourceText).field_2._M_allocated_capacity) {
    local_50._M_head_impl._0_4_ = uVar5;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_40->sourceText,iVar4,(uint *)&local_50);
  }
  else {
    *iVar4._M_current = uVar5;
    (local_40->sourceText)._M_string_length = (size_type)(iVar4._M_current + 1);
  }
  iVar4._M_current = (uint *)(local_40->sourceText)._M_string_length;
  if (iVar4._M_current == (uint *)(local_40->sourceText).field_2._M_allocated_capacity) {
    local_50._M_head_impl._0_4_ = uVar6;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_40->sourceText,iVar4,(uint *)&local_50);
  }
  else {
    *iVar4._M_current = uVar6;
    (local_40->sourceText)._M_string_length = (size_type)(iVar4._M_current + 1);
  }
  local_50._M_head_impl._0_4_ = sampled;
  iVar4._M_current = (uint *)(local_40->sourceText)._M_string_length;
  if (iVar4._M_current == (uint *)(local_40->sourceText).field_2._M_allocated_capacity) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_40->sourceText,iVar4,(uint *)&local_50);
  }
  else {
    *iVar4._M_current = sampled;
    (local_40->sourceText)._M_string_length = (size_type)(iVar4._M_current + 1);
  }
  local_50._M_head_impl._0_4_ = format;
  iVar4._M_current = (uint *)(local_40->sourceText)._M_string_length;
  if (iVar4._M_current == (uint *)(local_40->sourceText).field_2._M_allocated_capacity) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_40->sourceText,iVar4,(uint *)&local_50);
  }
  else {
    *iVar4._M_current = format;
    (local_40->sourceText)._M_string_length = (size_type)(iVar4._M_current + 1);
  }
  __position._M_current =
       local_48->groupedTypes[0x19].
       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      local_48->groupedTypes[0x19].
      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>
              ((vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
               (local_48->groupedTypes + 0x19),__position,(Instruction **)&local_40);
  }
  else {
    *__position._M_current = (Instruction *)local_40;
    pppIVar1 = &local_48->groupedTypes[0x19].
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  local_50._M_head_impl = (Instruction *)local_40;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&local_48->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
  if (local_50._M_head_impl != (Instruction *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&local_48->module,(Instruction *)local_40);
  switch(dim) {
  case Dim1D:
    if (sampled == 1) {
      local_50._M_head_impl._0_4_ = 0x2b;
    }
    else {
      local_50._M_head_impl._0_4_ = 0x2c;
    }
    break;
  default:
    goto switchD_001b6b92_caseD_1;
  case DimCube:
    if ((char)local_38 == '\0') goto switchD_001b6b92_caseD_1;
    if (sampled == 1) {
      local_50._M_head_impl._0_4_ = 0x2d;
    }
    else {
      local_50._M_head_impl._0_4_ = 0x22;
    }
    break;
  case DimRect:
    if (sampled == 1) {
      local_50._M_head_impl._0_4_ = 0x25;
    }
    else {
      local_50._M_head_impl._0_4_ = 0x24;
    }
    break;
  case DimBuffer:
    if (sampled == 1) {
      local_50._M_head_impl._0_4_ = 0x2e;
    }
    else {
      local_50._M_head_impl._0_4_ = 0x2f;
    }
    break;
  case DimSubpassData:
    local_50._M_head_impl._0_4_ = 0x28;
  }
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&local_48->capabilities,(Capability *)&local_50);
switchD_001b6b92_caseD_1:
  if ((char)local_34 == '\x01' && sampled == 2) {
    if (dim != DimSubpassData) {
      local_50._M_head_impl._0_4_ = 0x1b;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&local_48->capabilities,(Capability *)&local_50);
    }
    if ((char)local_38 != '\0') {
      local_50._M_head_impl._0_4_ = 0x30;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&local_48->capabilities,(Capability *)&local_50);
    }
  }
  return local_40->source;
}

Assistant:

Id Builder::makeImageType(Id sampledType, Dim dim, bool depth, bool arrayed, bool ms, unsigned sampled, ImageFormat format)
{
    assert(sampled == 1 || sampled == 2);

    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeImage].size(); ++t) {
        type = groupedTypes[OpTypeImage][t];
        if (type->getIdOperand(0) == sampledType &&
            type->getImmediateOperand(1) == (unsigned int)dim &&
            type->getImmediateOperand(2) == (  depth ? 1u : 0u) &&
            type->getImmediateOperand(3) == (arrayed ? 1u : 0u) &&
            type->getImmediateOperand(4) == (     ms ? 1u : 0u) &&
            type->getImmediateOperand(5) == sampled &&
            type->getImmediateOperand(6) == (unsigned int)format)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeImage);
    type->addIdOperand(sampledType);
    type->addImmediateOperand(   dim);
    type->addImmediateOperand(  depth ? 1 : 0);
    type->addImmediateOperand(arrayed ? 1 : 0);
    type->addImmediateOperand(     ms ? 1 : 0);
    type->addImmediateOperand(sampled);
    type->addImmediateOperand((unsigned int)format);

    groupedTypes[OpTypeImage].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    // deal with capabilities
    switch (dim) {
    case DimBuffer:
        if (sampled == 1)
            addCapability(CapabilitySampledBuffer);
        else
            addCapability(CapabilityImageBuffer);
        break;
    case Dim1D:
        if (sampled == 1)
            addCapability(CapabilitySampled1D);
        else
            addCapability(CapabilityImage1D);
        break;
    case DimCube:
        if (arrayed) {
            if (sampled == 1)
                addCapability(CapabilitySampledCubeArray);
            else
                addCapability(CapabilityImageCubeArray);
        }
        break;
    case DimRect:
        if (sampled == 1)
            addCapability(CapabilitySampledRect);
        else
            addCapability(CapabilityImageRect);
        break;
    case DimSubpassData:
        addCapability(CapabilityInputAttachment);
        break;
    default:
        break;
    }

    if (ms) {
        if (sampled == 2) {
            // Images used with subpass data are not storage
            // images, so don't require the capability for them.
            if (dim != Dim::DimSubpassData)
                addCapability(CapabilityStorageImageMultisample);
            if (arrayed)
                addCapability(CapabilityImageMSArray);
        }
    }

    return type->getResultId();
}